

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

AssertionExpr * slang::ast::bindUnknownPortConn(ASTContext *context,PropertyExprSyntax *syntax)

{
  SyntaxKind kind;
  int *piVar1;
  Compilation *compilation;
  SyntaxNode *syntax_00;
  Scope *args;
  Type *args_2;
  Symbol *args_1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  SyntaxNode **ppSVar5;
  ArbitrarySymbolExpression *args_00;
  undefined4 extraout_var_00;
  SimpleAssertionExpr *pSVar6;
  SimpleAssertionExpr *unaff_RBP;
  Symbol *symbol;
  HierarchicalReference *local_2b8;
  SourceRange local_2b0;
  HierarchicalReference hierRef;
  LookupResult result;
  
  if ((((syntax->super_SyntaxNode).kind == SimplePropertyExpr) &&
      (piVar1 = *(int **)&syntax[1].super_SyntaxNode, *piVar1 == 0x1b1)) &&
     (*(long *)(piVar1 + 8) == 0)) {
    compilation = ((context->scope).ptr)->compilation;
    ppSVar5 = (SyntaxNode **)(piVar1 + 6);
    do {
      syntax_00 = *ppSVar5;
      kind = (((ExpressionSyntax *)&syntax_00->kind)->super_SyntaxNode).kind;
      ppSVar5 = &(((NameSyntax *)(syntax_00 + 1))->super_ExpressionSyntax).super_SyntaxNode.
                 previewNode;
    } while (kind == ParenthesizedExpression);
    bVar2 = slang::syntax::NameSyntax::isKind(kind);
    if (bVar2) {
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ = (pointer)result.selectors.
                        super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                        .firstElement;
      result.found = (Symbol *)0x0;
      result.systemSubroutine._0_5_ = 0;
      result.systemSubroutine._5_3_ = 0;
      result.upwardCount = 0;
      result.flags.m_bits = '\0';
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .len = 0;
      result.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .cap = 4;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
           (pointer)result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
                    firstElement;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
      result.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.data_ =
           (pointer)result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                    super_SmallVectorBase<slang::Diagnostic>.firstElement;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.len = 0;
      result.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
      super_SmallVectorBase<slang::Diagnostic>.cap = 2;
      Lookup::name((NameSyntax *)syntax_00,context,(bitmask<slang::ast::LookupFlags>)0x0,&result);
      args_1 = result.found;
      bVar2 = true;
      if (((result.found != (Symbol *)0x0) &&
          (uVar4 = (result.found)->kind - InterfacePort, uVar4 < 0x1b)) &&
         ((0x4000053U >> (uVar4 & 0x1f) & 1) != 0)) {
        HierarchicalReference::fromLookup(&hierRef,compilation,&result);
        args = (context->scope).ptr;
        args_2 = compilation->voidType;
        local_2b8 = &hierRef;
        local_2b0 = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
        args_00 = BumpAllocator::
                  emplace<slang::ast::ArbitrarySymbolExpression,slang::ast::Scope_const&,slang::ast::Symbol_const&,slang::ast::Type_const&,slang::ast::HierarchicalReference*,slang::SourceRange>
                            (&compilation->super_BumpAllocator,args,args_1,args_2,&local_2b8,
                             &local_2b0);
        unaff_RBP = BumpAllocator::
                    emplace<slang::ast::SimpleAssertionExpr,slang::ast::ArbitrarySymbolExpression&,std::nullopt_t_const&>
                              (&compilation->super_BumpAllocator,args_00,(nullopt_t *)&std::nullopt)
        ;
        bVar2 = false;
      }
      LookupResult::~LookupResult(&result);
      if (!bVar2) {
        return &unaff_RBP->super_AssertionExpr;
      }
    }
    iVar3 = Expression::bind((int)syntax_00,(sockaddr *)context,0x280);
    pSVar6 = BumpAllocator::
             emplace<slang::ast::SimpleAssertionExpr,slang::ast::Expression_const&,std::nullopt_t_const&>
                       (&compilation->super_BumpAllocator,
                        (Expression *)CONCAT44(extraout_var_00,iVar3),(nullopt_t *)&std::nullopt);
  }
  else {
    ASTContext::resetFlags((ASTContext *)&result,context,(bitmask<slang::ast::ASTFlags>)0x40280);
    iVar3 = AssertionExpr::bind((AssertionExpr *)syntax,(int)&result,(sockaddr *)0x0,0);
    pSVar6 = (SimpleAssertionExpr *)CONCAT44(extraout_var,iVar3);
  }
  return &pSVar6->super_AssertionExpr;
}

Assistant:

static const AssertionExpr* bindUnknownPortConn(const ASTContext& context,
                                                const PropertyExprSyntax& syntax) {
    // We have to check for a simple reference to an interface instance or port here,
    // since we don't know whether this is an interface port connection or even
    // a normal connection with a virtual interface type.
    const auto flags = ASTFlags::AllowUnboundedLiteral | ASTFlags::StreamingAllowed;
    const SyntaxNode* node = &syntax;
    if (node->kind == SyntaxKind::SimplePropertyExpr) {
        node = node->as<SimplePropertyExprSyntax>().expr;
        if (node->kind == SyntaxKind::SimpleSequenceExpr) {
            auto& simpSeq = node->as<SimpleSequenceExprSyntax>();
            if (!simpSeq.repetition) {
                auto& comp = context.getCompilation();
                const ExpressionSyntax* expr = simpSeq.expr;
                while (expr->kind == SyntaxKind::ParenthesizedExpression)
                    expr = expr->as<ParenthesizedExpressionSyntax>().expression;

                if (NameSyntax::isKind(expr->kind)) {
                    LookupResult result;
                    Lookup::name(expr->as<NameSyntax>(), context, LookupFlags::None, result);
                    if (result.found) {
                        auto symbol = result.found;
                        if (symbol->kind == SymbolKind::Modport ||
                            symbol->kind == SymbolKind::InterfacePort ||
                            symbol->kind == SymbolKind::Instance ||
                            symbol->kind == SymbolKind::InstanceArray ||
                            symbol->kind == SymbolKind::UninstantiatedDef) {

                            auto hierRef = HierarchicalReference::fromLookup(comp, result);
                            auto hre = comp.emplace<ArbitrarySymbolExpression>(
                                *context.scope, *symbol, comp.getVoidType(), &hierRef,
                                syntax.sourceRange());

                            return comp.emplace<SimpleAssertionExpr>(*hre, std::nullopt);
                        }
                    }
                }

                return comp.emplace<SimpleAssertionExpr>(Expression::bind(*expr, context, flags),
                                                         std::nullopt);
            }
        }
    }

    return &AssertionExpr::bind(syntax,
                                context.resetFlags(ASTFlags::AssertionInstanceArgCheck | flags));
}